

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

string * dumpstrings_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t len,size_t *usedlen)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  uint uVar7;
  size_t *psVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  string escapecode;
  string escaped;
  string local_b8;
  string *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_t *local_88;
  size_t local_80;
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78[0] = local_68;
  local_98 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"\n\r\t","");
  if (len == 0) {
    uVar11 = 0;
    psVar8 = usedlen;
  }
  else {
    local_58 = -len;
    uVar10 = 1;
    bVar2 = false;
    uVar9 = 0;
    local_90 = &__return_storage_ptr__->field_2;
    local_88 = usedlen;
    local_80 = len;
    do {
      lVar4 = std::__cxx11::string::find((char)local_78,(ulong)(uint)(int)(char)buf[uVar10 - 1]);
      bVar6 = true;
      if (lVar4 == -1) {
        bVar1 = buf[uVar10 - 1];
        bVar6 = bVar1 == 0x5c || bVar1 == 0x22;
        uVar7 = (uint)bVar1;
        iVar3 = isprint(uVar7);
        __return_storage_ptr__ = local_98;
        if (((iVar3 != 0) || (uVar7 == 0x5c)) || (uVar7 == 0x22)) goto LAB_0012d982;
        if (bVar2) {
          std::__cxx11::string::append((char *)local_98);
          bVar2 = false;
        }
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        stringformat_abi_cxx11_(&local_b8,"%02x",(ulong)buf[uVar10 - 1]);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
LAB_0012dad4:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
LAB_0012d982:
        if (!bVar2) {
          if (__return_storage_ptr__->_M_string_length != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          bVar2 = true;
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (bVar6) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          local_b8._M_string_length = 0;
          local_b8.field_2._M_local_buf[0] = '\0';
          bVar1 = buf[uVar10 - 1];
          if (bVar1 < 0xd) {
            if (bVar1 == 9) {
              pcVar5 = "\\t";
              goto LAB_0012dab1;
            }
            if (bVar1 == 10) {
              pcVar5 = "\\n";
              goto LAB_0012dab1;
            }
LAB_0012db54:
            stringformat_abi_cxx11_(&local_50,"\\x%02x");
            std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            pcVar5 = "\\r";
            if (bVar1 != 0xd) {
              if (bVar1 == 0x22) {
                pcVar5 = "\\\"";
              }
              else {
                if (bVar1 != 0x5c) goto LAB_0012db54;
                pcVar5 = "\\\\";
              }
            }
LAB_0012dab1:
            std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)0x0,(ulong)pcVar5);
          }
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
          goto LAB_0012dad4;
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar7 = uVar9;
      if (uVar10 < local_80) {
        if (uVar10 == 1) {
          if (*buf < 0xe) {
            uVar9 = 0x2401 >> (*buf & 0x1f);
          }
          else {
            uVar9 = 0;
          }
        }
        if ((0xd < buf[uVar10]) || (uVar7 = 1, (0x2401U >> (buf[uVar10] & 0x1f) & 1) == 0)) {
          uVar11 = uVar10;
          if ((uVar9 & 1) != 0) break;
          uVar7 = 0;
        }
      }
      uVar9 = uVar7;
      lVar4 = local_58 + uVar10;
      uVar10 = uVar10 + 1;
      uVar11 = local_80;
    } while (lVar4 != 0);
    psVar8 = local_88;
    if (bVar2) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      psVar8 = local_88;
    }
  }
  *psVar8 = uVar11;
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dumpstrings(const uint8_t *buf, size_t len, size_t &usedlen)
{
    std::string result;
    bool bQuoted= false;
    bool bThisIsEolChar= false;
    std::string escaped= "\n\r\t";

    size_t i;
    for (i=0 ; i<len ; i++)
    {
        bool bNeedsEscape= escaped.find((char)buf[i])!=escaped.npos 
            || buf[i]=='\"' 
            || buf[i]=='\\';

        if (isprint(buf[i]) || bNeedsEscape) {
            if (!bQuoted) {
                if (!result.empty())
                    result += ",";
                result += "\"";
                bQuoted= true;
            }
            if (bNeedsEscape) {
                std::string escapecode;
                switch(buf[i]) {
                    case '\n': escapecode= "\\n"; break;
                    case '\r': escapecode= "\\r"; break;
                    case '\t': escapecode= "\\t"; break;
                    case '\"': escapecode= "\\\""; break;
                    case '\\': escapecode= "\\\\"; break;
                    default:
                       escapecode= stringformat("\\x%02x", buf[i]);
                }
                result += escapecode;
            }
            else {
                result += (char) buf[i];
            }
        }
        else {
            if (bQuoted) {
                result += "\"";
                bQuoted= false;
            }
            if (!result.empty())
                result += ",";
            result += stringformat("%02x", buf[i]);
        }
        if (i+1<len) {
            if (i==0)
                bThisIsEolChar = (buf[i]==0x0a || buf[i]==0x0d || buf[i]==0);

            bool bNextIsEolChar= (buf[i+1]==0x0a || buf[i+1]==0x0d || buf[i+1]==0);
            if (bThisIsEolChar && !bNextIsEolChar) {
                i++;
                break;
            }
            bThisIsEolChar= bNextIsEolChar;
        }
    }

    if (bQuoted) {
        result += "\"";
        bQuoted= false;
    }

    usedlen= i;

    return result;
}